

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse.c
# Opt level: O0

REF_STATUS ref_collapse_edge_mixed(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_BOOL *allowed)

{
  int local_34;
  int local_30;
  int local_2c;
  byte local_25;
  int local_24;
  REF_BOOL *allowed_local;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_GRID ref_grid_local;
  
  if ((node1 < 0) || (ref_grid->cell[9]->ref_adj->nnode <= node1)) {
    local_24 = -1;
  }
  else {
    local_24 = ref_grid->cell[9]->ref_adj->first[node1];
  }
  local_25 = 0;
  if (local_24 == -1) {
    if ((node1 < 0) || (ref_grid->cell[10]->ref_adj->nnode <= node1)) {
      local_2c = -1;
    }
    else {
      local_2c = ref_grid->cell[10]->ref_adj->first[node1];
    }
    local_25 = 0;
    if (local_2c == -1) {
      if ((node1 < 0) || (ref_grid->cell[0xb]->ref_adj->nnode <= node1)) {
        local_30 = -1;
      }
      else {
        local_30 = ref_grid->cell[0xb]->ref_adj->first[node1];
      }
      local_25 = 0;
      if (local_30 == -1) {
        if ((node1 < 0) || (ref_grid->cell[6]->ref_adj->nnode <= node1)) {
          local_34 = -1;
        }
        else {
          local_34 = ref_grid->cell[6]->ref_adj->first[node1];
        }
        local_25 = local_34 != -1 ^ 0xff;
      }
    }
  }
  *allowed = (uint)(local_25 & 1);
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_collapse_edge_mixed(REF_GRID ref_grid, REF_INT node0,
                                           REF_INT node1, REF_BOOL *allowed) {
  SUPRESS_UNUSED_COMPILER_WARNING(node0);

  *allowed = (ref_adj_empty(ref_cell_adj(ref_grid_pyr(ref_grid)), node1) &&
              ref_adj_empty(ref_cell_adj(ref_grid_pri(ref_grid)), node1) &&
              ref_adj_empty(ref_cell_adj(ref_grid_hex(ref_grid)), node1) &&
              ref_adj_empty(ref_cell_adj(ref_grid_qua(ref_grid)), node1));

  return REF_SUCCESS;
}